

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O3

void __thiscall
google::protobuf::Descriptor::DebugString
          (Descriptor *this,int depth,string *contents,DebugStringOptions *debug_string_options,
          bool include_opening_clause)

{
  _Rb_tree_header *p_Var1;
  once_flag *poVar2;
  Descriptor *pDVar3;
  OneofDescriptor *this_00;
  ulong uVar4;
  DebugStringOptions *debug_string_options_00;
  _Base_ptr p_Var5;
  int iVar6;
  FieldDescriptor *this_01;
  size_t sVar7;
  _Base_ptr p_Var8;
  long lVar9;
  int iVar10;
  undefined4 in_register_00000034;
  Descriptor *this_02;
  long lVar11;
  _Base_ptr p_Var12;
  _Base_ptr p_Var13;
  long lVar14;
  long lVar15;
  long lVar16;
  string prefix;
  SubstituteArg local_308;
  SubstituteArg local_2d8;
  ulong local_2a8;
  SubstituteArg local_2a0;
  SubstituteArg local_270;
  SubstituteArg local_240;
  SubstituteArg local_210;
  SubstituteArg local_1e0;
  SubstituteArg local_1b0;
  SubstituteArg local_180;
  SubstituteArg local_150;
  DebugStringOptions *local_120;
  string local_118;
  set<const_google::protobuf::Descriptor_*,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
  groups;
  SourceLocationCommentPrinter comment_printer;
  
  local_2a8 = CONCAT44(in_register_00000034,depth);
  if (*(char *)(*(long *)(this + 0x20) + 0x4b) == '\0') {
    prefix._M_dataplus._M_p = (pointer)&prefix.field_2;
    std::__cxx11::string::_M_construct((ulong)&prefix,(char)depth * '\x02');
    comment_printer.source_loc_.leading_comments._M_dataplus._M_p =
         (pointer)&comment_printer.source_loc_.leading_comments.field_2;
    comment_printer.source_loc_.leading_comments._M_string_length = 0;
    comment_printer.source_loc_.leading_comments.field_2._M_local_buf[0] = '\0';
    comment_printer.source_loc_.trailing_comments._M_dataplus._M_p =
         (pointer)&comment_printer.source_loc_.trailing_comments.field_2;
    comment_printer.source_loc_.trailing_comments._M_string_length = 0;
    comment_printer.source_loc_.trailing_comments.field_2._M_local_buf[0] = '\0';
    comment_printer.source_loc_.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    comment_printer.source_loc_.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    comment_printer.source_loc_.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    comment_printer.options_.include_comments = debug_string_options->include_comments;
    comment_printer.options_.elide_group_body = debug_string_options->elide_group_body;
    comment_printer.options_.elide_oneof_body = debug_string_options->elide_oneof_body;
    comment_printer.prefix_._M_dataplus._M_p = (pointer)&comment_printer.prefix_.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&comment_printer.prefix_,prefix._M_dataplus._M_p,
               prefix._M_dataplus._M_p +
               CONCAT44(prefix._M_string_length._4_4_,(_Rb_tree_color)prefix._M_string_length));
    uVar4 = local_2a8;
    if (debug_string_options->include_comments == true) {
      comment_printer.have_source_loc_ = GetSourceLocation(this,&comment_printer.source_loc_);
    }
    else {
      comment_printer.have_source_loc_ = false;
    }
    anon_unknown_1::SourceLocationCommentPrinter::AddPreComment(&comment_printer,contents);
    if (include_opening_clause) {
      groups._M_t._M_impl._0_8_ = prefix._M_dataplus._M_p;
      groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
           (_Rb_tree_color)prefix._M_string_length;
      local_308.text_ = (char *)**(long **)this;
      local_308.size_ = *(int *)(*(long **)this + 1);
      local_2d8.text_ = (char *)0x0;
      local_2d8.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_1e0.text_ = (char *)0x0;
      local_1e0.size_ = -1;
      local_210.text_ = (char *)0x0;
      local_210.size_ = -1;
      local_240.text_ = (char *)0x0;
      local_240.size_ = -1;
      local_270.text_ = (char *)0x0;
      local_270.size_ = -1;
      local_2a0.text_ = (char *)0x0;
      local_2a0.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"$0message $1",(SubstituteArg *)&groups,&local_308,&local_2d8,&local_180,
                 &local_150,&local_1e0,&local_210,&local_240,&local_270,&local_2a0);
    }
    std::__cxx11::string::append((char *)contents);
    iVar10 = (int)uVar4 + 1;
    anon_unknown_1::FormatLineOptions
              (iVar10,*(Message **)(this + 0x20),*(DescriptorPool **)(*(long *)(this + 0x10) + 0x10)
               ,contents);
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &groups._M_t._M_impl.super__Rb_tree_header._M_header;
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    groups._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_120 = debug_string_options;
    groups._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         groups._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (0 < *(int *)(this + 0x68)) {
      lVar14 = 0;
      lVar16 = 0;
      do {
        lVar15 = *(long *)(this + 0x28);
        poVar2 = *(once_flag **)(lVar15 + 0x30 + lVar14);
        if (poVar2 != (once_flag *)0x0) {
          local_2d8.text_ = (char *)(lVar15 + lVar14);
          local_308.text_ = (char *)FieldDescriptor::TypeOnceInit;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (poVar2,(_func_void_FieldDescriptor_ptr **)&local_308,
                     (FieldDescriptor **)&local_2d8);
        }
        if (*(int *)(lVar15 + 0x38 + lVar14) == 10) {
          lVar15 = *(long *)(this + 0x28);
          poVar2 = *(once_flag **)(lVar15 + 0x30 + lVar14);
          if (poVar2 != (once_flag *)0x0) {
            local_308.text_ = (char *)(lVar15 + lVar14);
            std::
            call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (poVar2,FieldDescriptor::TypeOnceInit,(FieldDescriptor **)&local_308);
          }
          local_2d8.text_ = *(char **)(lVar15 + 0x68 + lVar14);
          std::
          _Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
          ::_M_insert_unique<google::protobuf::Descriptor_const*>
                    ((_Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
                      *)&groups,(Descriptor **)&local_2d8);
        }
        lVar16 = lVar16 + 1;
        lVar14 = lVar14 + 0x98;
      } while (lVar16 < *(int *)(this + 0x68));
    }
    if (0 < *(int *)(this + 0x7c)) {
      lVar14 = 0;
      lVar16 = 0;
      do {
        lVar15 = *(long *)(this + 0x50);
        poVar2 = *(once_flag **)(lVar15 + 0x30 + lVar14);
        if (poVar2 != (once_flag *)0x0) {
          local_2d8.text_ = (char *)(lVar15 + lVar14);
          local_308.text_ = (char *)FieldDescriptor::TypeOnceInit;
          std::
          call_once<void(*)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                    (poVar2,(_func_void_FieldDescriptor_ptr **)&local_308,
                     (FieldDescriptor **)&local_2d8);
        }
        if (*(int *)(lVar15 + 0x38 + lVar14) == 10) {
          lVar15 = *(long *)(this + 0x50);
          poVar2 = *(once_flag **)(lVar15 + 0x30 + lVar14);
          if (poVar2 != (once_flag *)0x0) {
            local_308.text_ = (char *)(lVar15 + lVar14);
            std::
            call_once<void(&)(google::protobuf::FieldDescriptor_const*),google::protobuf::FieldDescriptor_const*>
                      (poVar2,FieldDescriptor::TypeOnceInit,(FieldDescriptor **)&local_308);
          }
          local_2d8.text_ = *(char **)(lVar15 + 0x68 + lVar14);
          std::
          _Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
          ::_M_insert_unique<google::protobuf::Descriptor_const*>
                    ((_Rb_tree<google::protobuf::Descriptor_const*,google::protobuf::Descriptor_const*,std::_Identity<google::protobuf::Descriptor_const*>,std::less<google::protobuf::Descriptor_const*>,std::allocator<google::protobuf::Descriptor_const*>>
                      *)&groups,(Descriptor **)&local_2d8);
        }
        lVar16 = lVar16 + 1;
        lVar14 = lVar14 + 0x98;
      } while (lVar16 < *(int *)(this + 0x7c));
    }
    debug_string_options_00 = local_120;
    iVar6 = *(int *)(this + 0x70);
    p_Var1 = &groups._M_t._M_impl.super__Rb_tree_header;
    if (0 < iVar6) {
      lVar14 = 0;
      do {
        this_02 = (Descriptor *)(lVar14 * 0x90 + *(long *)(this + 0x38));
        p_Var5 = groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var13 = &p_Var1->_M_header;
        if (groups._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_002c8870:
          DebugString(this_02,iVar10,contents,debug_string_options_00,true);
          iVar6 = *(int *)(this + 0x70);
        }
        else {
          do {
            p_Var12 = p_Var13;
            p_Var8 = p_Var5;
            pDVar3 = *(Descriptor **)(p_Var8 + 1);
            p_Var13 = p_Var8;
            if (pDVar3 < this_02) {
              p_Var13 = p_Var12;
            }
            p_Var5 = (&p_Var8->_M_left)[pDVar3 < this_02];
          } while ((&p_Var8->_M_left)[pDVar3 < this_02] != (_Base_ptr)0x0);
          if ((_Rb_tree_header *)p_Var13 == p_Var1) goto LAB_002c8870;
          if (pDVar3 < this_02) {
            p_Var8 = p_Var12;
          }
          if (this_02 < *(Descriptor **)(p_Var8 + 1)) goto LAB_002c8870;
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 < iVar6);
    }
    if (0 < *(int *)(this + 0x74)) {
      lVar14 = 0;
      lVar16 = 0;
      do {
        EnumDescriptor::DebugString
                  ((EnumDescriptor *)(*(long *)(this + 0x40) + lVar14),iVar10,contents,
                   debug_string_options_00);
        lVar16 = lVar16 + 1;
        lVar14 = lVar14 + 0x50;
      } while (lVar16 < *(int *)(this + 0x74));
    }
    if (0 < *(int *)(this + 0x68)) {
      lVar14 = 0;
      lVar16 = 0;
      do {
        this_00 = *(OneofDescriptor **)(*(long *)(this + 0x28) + 0x58 + lVar14);
        this_01 = (FieldDescriptor *)(*(long *)(this + 0x28) + lVar14);
        if (this_00 == (OneofDescriptor *)0x0) {
          FieldDescriptor::DebugString(this_01,iVar10,PRINT_LABEL,contents,debug_string_options_00);
        }
        else if (this_01 == (FieldDescriptor *)**(long **)(this_00 + 0x20)) {
          OneofDescriptor::DebugString(this_00,iVar10,contents,debug_string_options_00);
        }
        lVar16 = lVar16 + 1;
        lVar14 = lVar14 + 0x98;
      } while (lVar16 < *(int *)(this + 0x68));
    }
    if (0 < *(int *)(this + 0x78)) {
      lVar14 = 0;
      lVar16 = 0;
      do {
        local_308.text_ = prefix._M_dataplus._M_p;
        local_308.size_ = (_Rb_tree_color)prefix._M_string_length;
        local_2d8.text_ =
             FastInt32ToBuffer(*(int32 *)(*(long *)(this + 0x48) + lVar14),local_2d8.scratch_);
        sVar7 = strlen(local_2d8.text_);
        local_2d8.size_ = (int)sVar7;
        local_180.text_ =
             FastInt32ToBuffer(*(int *)(*(long *)(this + 0x48) + 4 + lVar14) + -1,local_180.scratch_
                              );
        sVar7 = strlen(local_180.text_);
        local_180.size_ = (int)sVar7;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_1e0.text_ = (char *)0x0;
        local_1e0.size_ = -1;
        local_210.text_ = (char *)0x0;
        local_210.size_ = -1;
        local_240.text_ = (char *)0x0;
        local_240.size_ = -1;
        local_270.text_ = (char *)0x0;
        local_270.size_ = -1;
        local_2a0.text_ = (char *)0x0;
        local_2a0.size_ = -1;
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        strings::SubstituteAndAppend
                  (contents,"$0  extensions $1 to $2;\n",&local_308,&local_2d8,&local_180,&local_150
                   ,&local_1e0,&local_210,&local_240,&local_270,&local_2a0,&local_1b0);
        lVar16 = lVar16 + 1;
        lVar14 = lVar14 + 0x10;
      } while (lVar16 < *(int *)(this + 0x78));
    }
    if (0 < *(int *)(this + 0x7c)) {
      local_2a8 = (ulong)((int)local_2a8 + 2);
      lVar15 = 0;
      lVar16 = 0;
      lVar14 = 0;
      do {
        lVar11 = *(long *)(this + 0x50);
        lVar9 = *(long *)(lVar11 + 0x50 + lVar15);
        if (lVar9 != lVar14) {
          if (lVar15 != 0) {
            local_308.text_ = prefix._M_dataplus._M_p;
            local_308.size_ = (_Rb_tree_color)prefix._M_string_length;
            local_2d8.text_ = (char *)0x0;
            local_2d8.size_ = -1;
            local_180.text_ = (char *)0x0;
            local_180.size_ = -1;
            local_150.text_ = (char *)0x0;
            local_150.size_ = -1;
            local_1e0.text_ = (char *)0x0;
            local_1e0.size_ = -1;
            local_210.text_ = (char *)0x0;
            local_210.size_ = -1;
            local_240.text_ = (char *)0x0;
            local_240.size_ = -1;
            local_270.text_ = (char *)0x0;
            local_270.size_ = -1;
            local_2a0.text_ = (char *)0x0;
            local_2a0.size_ = -1;
            local_1b0.text_ = (char *)0x0;
            local_1b0.size_ = -1;
            strings::SubstituteAndAppend
                      (contents,"$0  }\n",&local_308,&local_2d8,&local_180,&local_150,&local_1e0,
                       &local_210,&local_240,&local_270,&local_2a0,&local_1b0);
            lVar9 = *(long *)(*(long *)(this + 0x50) + 0x50 + lVar15);
          }
          local_308.text_ = prefix._M_dataplus._M_p;
          local_308.size_ = (_Rb_tree_color)prefix._M_string_length;
          local_2d8.text_ = (char *)**(long **)(lVar9 + 8);
          local_2d8.size_ = (int)(*(long **)(lVar9 + 8))[1];
          local_180.text_ = (char *)0x0;
          local_180.size_ = -1;
          local_150.text_ = (char *)0x0;
          local_150.size_ = -1;
          local_1e0.text_ = (char *)0x0;
          local_1e0.size_ = -1;
          local_210.text_ = (char *)0x0;
          local_210.size_ = -1;
          local_240.text_ = (char *)0x0;
          local_240.size_ = -1;
          local_270.text_ = (char *)0x0;
          local_270.size_ = -1;
          local_2a0.text_ = (char *)0x0;
          local_2a0.size_ = -1;
          local_1b0.text_ = (char *)0x0;
          local_1b0.size_ = -1;
          strings::SubstituteAndAppend
                    (contents,"$0  extend .$1 {\n",&local_308,&local_2d8,&local_180,&local_150,
                     &local_1e0,&local_210,&local_240,&local_270,&local_2a0,&local_1b0);
          lVar11 = *(long *)(this + 0x50);
          lVar14 = lVar9;
        }
        FieldDescriptor::DebugString
                  ((FieldDescriptor *)(lVar11 + lVar15),(int)local_2a8,PRINT_LABEL,contents,
                   local_120);
        lVar16 = lVar16 + 1;
        lVar15 = lVar15 + 0x98;
      } while (lVar16 < *(int *)(this + 0x7c));
      if (0 < *(int *)(this + 0x7c)) {
        local_308.text_ = prefix._M_dataplus._M_p;
        local_308.size_ = (_Rb_tree_color)prefix._M_string_length;
        local_2d8.text_ = (char *)0x0;
        local_2d8.size_ = -1;
        local_180.text_ = (char *)0x0;
        local_180.size_ = -1;
        local_150.text_ = (char *)0x0;
        local_150.size_ = -1;
        local_1e0.text_ = (char *)0x0;
        local_1e0.size_ = -1;
        local_210.text_ = (char *)0x0;
        local_210.size_ = -1;
        local_240.text_ = (char *)0x0;
        local_240.size_ = -1;
        local_270.text_ = (char *)0x0;
        local_270.size_ = -1;
        local_2a0.text_ = (char *)0x0;
        local_2a0.size_ = -1;
        local_1b0.text_ = (char *)0x0;
        local_1b0.size_ = -1;
        strings::SubstituteAndAppend
                  (contents,"$0  }\n",&local_308,&local_2d8,&local_180,&local_150,&local_1e0,
                   &local_210,&local_240,&local_270,&local_2a0,&local_1b0);
      }
    }
    if (0 < *(int *)(this + 0x80)) {
      local_308.text_ = prefix._M_dataplus._M_p;
      local_308.size_ = (_Rb_tree_color)prefix._M_string_length;
      local_2d8.text_ = (char *)0x0;
      local_2d8.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_1e0.text_ = (char *)0x0;
      local_1e0.size_ = -1;
      local_210.text_ = (char *)0x0;
      local_210.size_ = -1;
      local_240.text_ = (char *)0x0;
      local_240.size_ = -1;
      local_270.text_ = (char *)0x0;
      local_270.size_ = -1;
      local_2a0.text_ = (char *)0x0;
      local_2a0.size_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"$0  reserved ",&local_308,&local_2d8,&local_180,&local_150,&local_1e0,
                 &local_210,&local_240,&local_270,&local_2a0,&local_1b0);
      if (0 < *(int *)(this + 0x80)) {
        lVar14 = 0;
        do {
          lVar16 = *(long *)(this + 0x58);
          iVar10 = *(int *)(lVar16 + lVar14 * 8);
          if (*(int *)(lVar16 + 4 + lVar14 * 8) == iVar10 + 1) {
            local_308.text_ = FastInt32ToBuffer(iVar10,local_308.scratch_);
            sVar7 = strlen(local_308.text_);
            local_308.size_ = (int)sVar7;
            local_2d8.text_ = (char *)0x0;
            local_2d8.size_ = -1;
            local_180.text_ = (char *)0x0;
            local_180.size_ = -1;
            local_150.text_ = (char *)0x0;
            local_150.size_ = -1;
            local_1e0.text_ = (char *)0x0;
            local_1e0.size_ = -1;
            local_210.text_ = (char *)0x0;
            local_210.size_ = -1;
            local_240.text_ = (char *)0x0;
            local_240.size_ = -1;
            local_270.text_ = (char *)0x0;
            local_270.size_ = -1;
            local_2a0.text_ = (char *)0x0;
            local_2a0.size_ = -1;
            local_1b0.text_ = (char *)0x0;
            local_1b0.size_ = -1;
            strings::SubstituteAndAppend
                      (contents,"$0, ",&local_308,&local_2d8,&local_180,&local_150,&local_1e0,
                       &local_210,&local_240,&local_270,&local_2a0,&local_1b0);
          }
          else {
            local_308.text_ = FastInt32ToBuffer(iVar10,local_308.scratch_);
            sVar7 = strlen(local_308.text_);
            local_308.size_ = (int)sVar7;
            local_2d8.text_ =
                 FastInt32ToBuffer(*(int *)(lVar16 + 4 + lVar14 * 8) + -1,local_2d8.scratch_);
            sVar7 = strlen(local_2d8.text_);
            local_2d8.size_ = (int)sVar7;
            local_180.text_ = (char *)0x0;
            local_180.size_ = -1;
            local_150.text_ = (char *)0x0;
            local_150.size_ = -1;
            local_1e0.text_ = (char *)0x0;
            local_1e0.size_ = -1;
            local_210.text_ = (char *)0x0;
            local_210.size_ = -1;
            local_240.text_ = (char *)0x0;
            local_240.size_ = -1;
            local_270.text_ = (char *)0x0;
            local_270.size_ = -1;
            local_2a0.text_ = (char *)0x0;
            local_2a0.size_ = -1;
            local_1b0.text_ = (char *)0x0;
            local_1b0.size_ = -1;
            strings::SubstituteAndAppend
                      (contents,"$0 to $1, ",&local_308,&local_2d8,&local_180,&local_150,&local_1e0,
                       &local_210,&local_240,&local_270,&local_2a0,&local_1b0);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < *(int *)(this + 0x80));
      }
      std::__cxx11::string::replace
                ((ulong)contents,contents->_M_string_length - 2,(char *)0x2,0x598f4d);
    }
    if (0 < *(int *)(this + 0x84)) {
      local_308.text_ = prefix._M_dataplus._M_p;
      local_308.size_ = (_Rb_tree_color)prefix._M_string_length;
      local_2d8.text_ = (char *)0x0;
      local_2d8.size_ = -1;
      local_180.text_ = (char *)0x0;
      local_180.size_ = -1;
      local_150.text_ = (char *)0x0;
      local_150.size_ = -1;
      local_1e0.text_ = (char *)0x0;
      local_1e0.size_ = -1;
      local_210.text_ = (char *)0x0;
      local_210.size_ = -1;
      local_240.text_ = (char *)0x0;
      local_240.size_ = -1;
      local_270.text_ = (char *)0x0;
      local_270.size_ = -1;
      local_2a0.text_ = (char *)0x0;
      local_2a0.size_ = -1;
      local_1b0.text_ = (char *)0x0;
      local_1b0.size_ = -1;
      strings::SubstituteAndAppend
                (contents,"$0  reserved ",&local_308,&local_2d8,&local_180,&local_150,&local_1e0,
                 &local_210,&local_240,&local_270,&local_2a0,&local_1b0);
      if (0 < *(int *)(this + 0x84)) {
        lVar14 = 0;
        do {
          CEscape(&local_118,*(string **)(*(long *)(this + 0x60) + lVar14 * 8));
          local_308.text_ = local_118._M_dataplus._M_p;
          local_308.size_ = (_Rb_tree_color)local_118._M_string_length;
          local_2d8.text_ = (char *)0x0;
          local_2d8.size_ = -1;
          local_180.text_ = (char *)0x0;
          local_180.size_ = -1;
          local_150.text_ = (char *)0x0;
          local_150.size_ = -1;
          local_1e0.text_ = (char *)0x0;
          local_1e0.size_ = -1;
          local_210.text_ = (char *)0x0;
          local_210.size_ = -1;
          local_240.text_ = (char *)0x0;
          local_240.size_ = -1;
          local_270.text_ = (char *)0x0;
          local_270.size_ = -1;
          local_2a0.text_ = (char *)0x0;
          local_2a0.size_ = -1;
          local_1b0.text_ = (char *)0x0;
          local_1b0.size_ = -1;
          strings::SubstituteAndAppend
                    (contents,"\"$0\", ",&local_308,&local_2d8,&local_180,&local_150,&local_1e0,
                     &local_210,&local_240,&local_270,&local_2a0,&local_1b0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_118._M_dataplus._M_p != &local_118.field_2) {
            operator_delete(local_118._M_dataplus._M_p);
          }
          lVar14 = lVar14 + 1;
        } while (lVar14 < *(int *)(this + 0x84));
      }
      std::__cxx11::string::replace
                ((ulong)contents,contents->_M_string_length - 2,(char *)0x2,0x598f4d);
    }
    local_308.text_ = prefix._M_dataplus._M_p;
    local_308.size_ = (_Rb_tree_color)prefix._M_string_length;
    local_2d8.text_ = (char *)0x0;
    local_2d8.size_ = -1;
    local_180.text_ = (char *)0x0;
    local_180.size_ = -1;
    local_150.text_ = (char *)0x0;
    local_150.size_ = -1;
    local_1e0.text_ = (char *)0x0;
    local_1e0.size_ = -1;
    local_210.text_ = (char *)0x0;
    local_210.size_ = -1;
    local_240.text_ = (char *)0x0;
    local_240.size_ = -1;
    local_270.text_ = (char *)0x0;
    local_270.size_ = -1;
    local_2a0.text_ = (char *)0x0;
    local_2a0.size_ = -1;
    local_1b0.text_ = (char *)0x0;
    local_1b0.size_ = -1;
    strings::SubstituteAndAppend
              (contents,"$0}\n",&local_308,&local_2d8,&local_180,&local_150,&local_1e0,&local_210,
               &local_240,&local_270,&local_2a0,&local_1b0);
    anon_unknown_1::SourceLocationCommentPrinter::AddPostComment(&comment_printer,contents);
    std::
    _Rb_tree<const_google::protobuf::Descriptor_*,_const_google::protobuf::Descriptor_*,_std::_Identity<const_google::protobuf::Descriptor_*>,_std::less<const_google::protobuf::Descriptor_*>,_std::allocator<const_google::protobuf::Descriptor_*>_>
    ::~_Rb_tree(&groups._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)comment_printer.prefix_._M_dataplus._M_p != &comment_printer.prefix_.field_2) {
      operator_delete(comment_printer.prefix_._M_dataplus._M_p);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&comment_printer.source_loc_.leading_detached_comments);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)comment_printer.source_loc_.trailing_comments._M_dataplus._M_p !=
        &comment_printer.source_loc_.trailing_comments.field_2) {
      operator_delete(comment_printer.source_loc_.trailing_comments._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)comment_printer.source_loc_.leading_comments._M_dataplus._M_p !=
        &comment_printer.source_loc_.leading_comments.field_2) {
      operator_delete(comment_printer.source_loc_.leading_comments._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)prefix._M_dataplus._M_p != &prefix.field_2) {
      operator_delete(prefix._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void Descriptor::DebugString(int depth, std::string* contents,
                             const DebugStringOptions& debug_string_options,
                             bool include_opening_clause) const {
  if (options().map_entry()) {
    // Do not generate debug string for auto-generated map-entry type.
    return;
  }
  std::string prefix(depth * 2, ' ');
  ++depth;

  SourceLocationCommentPrinter comment_printer(this, prefix,
                                               debug_string_options);
  comment_printer.AddPreComment(contents);

  if (include_opening_clause) {
    strings::SubstituteAndAppend(contents, "$0message $1", prefix, name());
  }
  contents->append(" {\n");

  FormatLineOptions(depth, options(), file()->pool(), contents);

  // Find all the 'group' types for fields and extensions; we will not output
  // their nested definitions (those will be done with their group field
  // descriptor).
  std::set<const Descriptor*> groups;
  for (int i = 0; i < field_count(); i++) {
    if (field(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(field(i)->message_type());
    }
  }
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->type() == FieldDescriptor::TYPE_GROUP) {
      groups.insert(extension(i)->message_type());
    }
  }

  for (int i = 0; i < nested_type_count(); i++) {
    if (groups.count(nested_type(i)) == 0) {
      nested_type(i)->DebugString(depth, contents, debug_string_options,
                                  /* include_opening_clause */ true);
    }
  }
  for (int i = 0; i < enum_type_count(); i++) {
    enum_type(i)->DebugString(depth, contents, debug_string_options);
  }
  for (int i = 0; i < field_count(); i++) {
    if (field(i)->containing_oneof() == nullptr) {
      field(i)->DebugString(depth, FieldDescriptor::PRINT_LABEL, contents,
                            debug_string_options);
    } else if (field(i)->containing_oneof()->field(0) == field(i)) {
      // This is the first field in this oneof, so print the whole oneof.
      field(i)->containing_oneof()->DebugString(depth, contents,
                                                debug_string_options);
    }
  }

  for (int i = 0; i < extension_range_count(); i++) {
    strings::SubstituteAndAppend(contents, "$0  extensions $1 to $2;\n", prefix,
                                 extension_range(i)->start,
                                 extension_range(i)->end - 1);
  }

  // Group extensions by what they extend, so they can be printed out together.
  const Descriptor* containing_type = nullptr;
  for (int i = 0; i < extension_count(); i++) {
    if (extension(i)->containing_type() != containing_type) {
      if (i > 0) strings::SubstituteAndAppend(contents, "$0  }\n", prefix);
      containing_type = extension(i)->containing_type();
      strings::SubstituteAndAppend(contents, "$0  extend .$1 {\n", prefix,
                                   containing_type->full_name());
    }
    extension(i)->DebugString(depth + 1, FieldDescriptor::PRINT_LABEL, contents,
                              debug_string_options);
  }
  if (extension_count() > 0)
    strings::SubstituteAndAppend(contents, "$0  }\n", prefix);

  if (reserved_range_count() > 0) {
    strings::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_range_count(); i++) {
      const Descriptor::ReservedRange* range = reserved_range(i);
      if (range->end == range->start + 1) {
        strings::SubstituteAndAppend(contents, "$0, ", range->start);
      } else {
        strings::SubstituteAndAppend(contents, "$0 to $1, ", range->start,
                                     range->end - 1);
      }
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  if (reserved_name_count() > 0) {
    strings::SubstituteAndAppend(contents, "$0  reserved ", prefix);
    for (int i = 0; i < reserved_name_count(); i++) {
      strings::SubstituteAndAppend(contents, "\"$0\", ",
                                   CEscape(reserved_name(i)));
    }
    contents->replace(contents->size() - 2, 2, ";\n");
  }

  strings::SubstituteAndAppend(contents, "$0}\n", prefix);
  comment_printer.AddPostComment(contents);
}